

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> * __thiscall
uWS::HttpRouter<uWS::HttpContextData<false>::RouterData>::getUrlSegment
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *__return_storage_ptr__
          ,HttpRouter<uWS::HttpContextData<false>::RouterData> *this,int urlSegment)

{
  char **ppcVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  size_type __n;
  ulong uVar9;
  
  iVar2 = this->urlSegmentTop;
  if (iVar2 < urlSegment) {
    sVar6 = (this->currentUrl)._M_len;
    if (99 < urlSegment || sVar6 == 0) {
      (__return_storage_ptr__->first)._M_len = 0;
      (__return_storage_ptr__->first)._M_str = (char *)0x0;
      bVar4 = true;
      goto LAB_0014052c;
    }
    pcVar8 = (this->currentUrl)._M_str + 1;
    (this->currentUrl)._M_str = pcVar8;
    uVar9 = sVar6 - 1;
    (this->currentUrl)._M_len = uVar9;
    if (uVar9 == 0) {
      uVar7 = 0xffffffffffffffff;
    }
    else {
      pvVar5 = memchr(pcVar8,0x2f,uVar9);
      uVar7 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar8;
    }
    if (uVar7 == 0xffffffffffffffff) {
      this->urlSegmentVector[urlSegment]._M_len = uVar9;
      this->urlSegmentVector[urlSegment]._M_str = pcVar8;
      this->urlSegmentTop = iVar2 + 1;
      uVar3 = (this->currentUrl)._M_len;
      sVar6 = uVar3 - uVar9;
      uVar7 = uVar9;
      if (uVar3 < uVar9) goto LAB_00140562;
    }
    else {
      if (uVar7 <= uVar9) {
        uVar9 = uVar7;
      }
      this->urlSegmentVector[urlSegment]._M_len = uVar9;
      this->urlSegmentVector[urlSegment]._M_str = pcVar8;
      this->urlSegmentTop = iVar2 + 1;
      uVar9 = (this->currentUrl)._M_len;
      sVar6 = uVar9 - uVar7;
      if (uVar9 < uVar7) {
LAB_00140562:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar7);
      }
    }
    (this->currentUrl)._M_len = sVar6;
    ppcVar1 = &(this->currentUrl)._M_str;
    *ppcVar1 = *ppcVar1 + uVar7;
  }
  pcVar8 = this->urlSegmentVector[urlSegment]._M_str;
  (__return_storage_ptr__->first)._M_len = this->urlSegmentVector[urlSegment]._M_len;
  (__return_storage_ptr__->first)._M_str = pcVar8;
  bVar4 = false;
LAB_0014052c:
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string_view, bool> getUrlSegment(int urlSegment) {
        if (urlSegment > urlSegmentTop) {
            /* Signal as STOP when we have no more URL or stack space */
            if (!currentUrl.length() || urlSegment > 99) {
                return {{}, true};
            }

            /* We always stand on a slash here, so step over it */
            currentUrl.remove_prefix(1);

            auto segmentLength = currentUrl.find('/');
            if (segmentLength == std::string::npos) {
                segmentLength = currentUrl.length();

                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            } else {
                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            }
        }
        /* In any case we return it */
        return {urlSegmentVector[urlSegment], false};
    }